

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::AuxNode,_capnp::compiler::NodeTranslator::AuxNode_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  AuxNode *pAVar1;
  ExceptionGuard *this_local;
  
  while (this->start < this->pos) {
    pAVar1 = this->pos;
    this->pos = pAVar1 + -1;
    dtor<capnp::compiler::NodeTranslator::AuxNode>(pAVar1 + -1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }